

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatementReader.cpp
# Opt level: O0

void __thiscall
Js::
StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
::Create(StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
         *this,byte *byteCodeStart,uint startOffset,SmallSpanSequence *statementMap,
        List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *fullstatementMap)

{
  byte *pbVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  StatementMap *pSVar8;
  Type *this_00;
  StatementMap *nextMap;
  StatementData data;
  byte *currentLocation;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *fullstatementMap_local;
  SmallSpanSequence *statementMap_local;
  uint startOffset_local;
  byte *byteCodeStart_local;
  StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  *this_local;
  
  this->m_startLocation = byteCodeStart;
  data = (StatementData)((long)this->m_startLocation + (ulong)startOffset);
  this->m_statementMap = statementMap;
  this->m_fullstatementMap = fullstatementMap;
  if ((this->m_statementMap == (SmallSpanSequence *)0x0) ||
     (uVar4 = SmallSpanSequence::Count(this->m_statementMap), uVar4 == 0)) {
    if ((this->m_fullstatementMap ==
         (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0) ||
       (iVar6 = JsUtil::
                ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>::
                Count(&this->m_fullstatementMap->
                       super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                     ), iVar6 == 0)) {
      this->m_nextStatementBoundary = (byte *)((long)data + -1);
    }
    else {
      this->m_statementIndex = 0;
      this->m_startOfStatement = true;
      pSVar8 = FunctionBody::
               GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
                         (this->m_fullstatementMap,&this->m_statementIndex);
      if (pSVar8 == (StatementMap *)0x0) {
        this->m_nextStatementBoundary = (byte *)((long)data + -1);
      }
      else {
        pbVar1 = this->m_startLocation;
        this_00 = JsUtil::
                  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->m_fullstatementMap,this->m_statementIndex);
        pSVar8 = Memory::WriteBarrierPtr<Js::FunctionBody::StatementMap>::operator->(this_00);
        this->m_nextStatementBoundary = pbVar1 + (pSVar8->byteCodeSpan).begin;
        while (this->m_nextStatementBoundary < (ulong)data) {
          MoveNextStatementBoundary(this);
        }
      }
    }
  }
  else {
    SmallSpanSequence::Reset(this->m_statementMap,&this->m_statementMapIter);
    this->m_statementIndex = 0;
    this->m_startOfStatement = true;
    StatementData::StatementData((StatementData *)&nextMap);
    BVar5 = SmallSpanSequence::Seek
                      (this->m_statementMap,this->m_statementIndex,(StatementData *)&nextMap);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/StatementReader.cpp"
                                  ,0x28,"(0)","FALSE");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    this->m_nextStatementBoundary = this->m_startLocation + nextMap._4_4_;
    while (this->m_nextStatementBoundary < (ulong)data) {
      MoveNextStatementBoundary(this);
    }
  }
  return;
}

Assistant:

void StatementReader<TStatementMapList>::Create(
        _In_ const byte * byteCodeStart,
        uint startOffset,
        Js::SmallSpanSequence * statementMap,
        TStatementMapList* fullstatementMap)
    {
        m_startLocation = byteCodeStart;

        const byte * currentLocation = m_startLocation + startOffset;

        m_statementMap = statementMap;
        m_fullstatementMap = fullstatementMap;

        if (m_statementMap && m_statementMap->Count())
        {
            m_statementMap->Reset(m_statementMapIter);

            m_statementIndex = 0;
            m_startOfStatement = true;

            StatementData data;
            if (!m_statementMap->Seek(m_statementIndex, data))
            {
                Assert(FALSE);
            }

            m_nextStatementBoundary = m_startLocation + data.bytecodeBegin;

            // If we starting in the middle of the function (e.g., loop body), find out where the next statement is.
            while (m_nextStatementBoundary < currentLocation)
            {
                this->MoveNextStatementBoundary();
            }
        }
        else if (m_fullstatementMap && m_fullstatementMap->Count())
        {
            m_statementIndex = 0;
            m_startOfStatement = true;
            FunctionBody::StatementMap *nextMap = Js::FunctionBody::GetNextNonSubexpressionStatementMap(m_fullstatementMap, m_statementIndex);
            if (!nextMap)
            {
                // set to a location that will never match
                m_nextStatementBoundary = currentLocation - 1;
            }
            else
            {
                m_nextStatementBoundary = m_startLocation + m_fullstatementMap->Item(m_statementIndex)->byteCodeSpan.begin;

                // If we starting in the middle of the function (e.g., loop body), find out where the next statement is.
                while (m_nextStatementBoundary < currentLocation)
                {
                    this->MoveNextStatementBoundary();
                }
            }
        }
        else
        {
            // set to a location that will never match
            m_nextStatementBoundary = currentLocation - 1;
        }
    }